

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O0

int CfdGetPsbtData(void *handle,void *psbt_handle,char **psbt_base64,char **psbt_hex)

{
  undefined8 uVar1;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  CfdException *except;
  exception *std_except;
  CfdCapiPsbtHandle *psbt_obj;
  char *work_hex;
  char *work_base64;
  int result;
  string *in_stack_fffffffffffffeb0;
  CfdException *this;
  ByteData local_118;
  string *in_stack_ffffffffffffff00;
  string local_e0;
  undefined1 local_ba;
  undefined1 local_b9 [33];
  CfdSourceLocation local_98;
  long local_80;
  allocator local_71;
  string local_70 [24];
  string *in_stack_ffffffffffffffa8;
  void *in_stack_ffffffffffffffb0;
  char *local_40;
  char *local_38;
  
  local_38 = (char *)0x0;
  local_40 = (char *)0x0;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"PsbtHandle",&local_71);
  cfd::capi::CheckBuffer(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  if (*(long *)(in_RSI + 0x18) == 0) {
    local_98.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_98.filename = local_98.filename + 1;
    local_98.line = 0x161;
    local_98.funcname = "CfdGetPsbtData";
    cfd::core::logger::warn<>(&local_98,"psbt is null.");
    local_ba = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    this = (CfdException *)local_b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_b9 + 1),"Failed to handle statement. psbt is null.",
               (allocator *)this);
    cfd::core::CfdException::CfdException
              (this,(CfdError)((ulong)uVar1 >> 0x20),in_stack_fffffffffffffeb0);
    local_ba = 0;
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_80 = in_RSI;
  if (in_RDX != (undefined8 *)0x0) {
    cfd::core::Psbt::GetBase64_abi_cxx11_(&local_e0,*(Psbt **)(in_RSI + 0x18));
    local_38 = cfd::capi::CreateString(in_stack_ffffffffffffff00);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  if (in_RCX != (undefined8 *)0x0) {
    cfd::core::Psbt::GetData(&local_118,*(Psbt **)(local_80 + 0x18));
    cfd::core::ByteData::GetHex_abi_cxx11_((string *)&stack0xffffffffffffff00,&local_118);
    local_40 = cfd::capi::CreateString(in_stack_ffffffffffffff00);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff00);
    cfd::core::ByteData::~ByteData((ByteData *)0x5e7921);
  }
  if (in_RDX != (undefined8 *)0x0) {
    *in_RDX = local_38;
  }
  if (in_RCX != (undefined8 *)0x0) {
    *in_RCX = local_40;
  }
  return 0;
}

Assistant:

int CfdGetPsbtData(
    void* handle, void* psbt_handle, char** psbt_base64, char** psbt_hex) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_base64 = nullptr;
  char* work_hex = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    if (psbt_base64 != nullptr) {
      work_base64 = CreateString(psbt_obj->psbt->GetBase64());
    }
    if (psbt_hex != nullptr) {
      work_hex = CreateString(psbt_obj->psbt->GetData().GetHex());
    }
    if (psbt_base64 != nullptr) *psbt_base64 = work_base64;
    if (psbt_hex != nullptr) *psbt_hex = work_hex;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_base64, &work_hex);
  return result;
}